

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[132]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *FirstArg,
               char (*RestArgs) [132])

{
  char (*RestArgs_local) [132];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *FirstArg_local;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char[132]>(ss,RestArgs);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}